

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash2012.c
# Opt level: O3

void gost2012_finish_hash(gost2012_hash_ctx *CTX,uchar *digest)

{
  uint512_u *h;
  uint512_u *N;
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long_long uVar5;
  unsigned_long_long uVar6;
  unsigned_long_long uVar7;
  uint i;
  long lVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  
  bVar9 = false;
  memset((void *)((long)&CTX->buffer + CTX->bufsize),0,0x40 - CTX->bufsize);
  (CTX->buffer).B[CTX->bufsize] = '\x01';
  h = &CTX->h;
  N = &CTX->N;
  g(h,N,&CTX->buffer);
  lVar8 = 0x18;
  do {
    uVar2 = *(ulong *)((long)CTX + lVar8 * 8 + -0xc0);
    puVar1 = (CTX->buffer).QWORD + lVar8;
    uVar3 = (ulong)bVar9;
    uVar4 = *puVar1 + uVar2;
    bVar9 = CARRY8(*puVar1,uVar2) || CARRY8(uVar4,uVar3);
    *puVar1 = uVar4 + uVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x20);
  (CTX->buffer).QWORD[5] = 0;
  (CTX->buffer).QWORD[6] = 0;
  (CTX->buffer).QWORD[3] = 0;
  (CTX->buffer).QWORD[4] = 0;
  (CTX->buffer).QWORD[1] = 0;
  (CTX->buffer).QWORD[2] = 0;
  (CTX->buffer).QWORD[7] = 0;
  (CTX->buffer).QWORD[0] = CTX->bufsize << 3;
  lVar8 = 0;
  bVar9 = false;
  do {
    puVar1 = N->QWORD + lVar8;
    uVar2 = (ulong)bVar9;
    uVar3 = *puVar1 + (CTX->buffer).QWORD[lVar8];
    bVar9 = CARRY8(*puVar1,(CTX->buffer).QWORD[lVar8]) || CARRY8(uVar3,uVar2);
    *puVar1 = uVar3 + uVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  g(h,&buffer0,N);
  g(h,&buffer0,&CTX->Sigma);
  CTX->bufsize = 0;
  if (CTX->digest_size == 0x100) {
    uVar10 = *(undefined4 *)((long)&CTX->h + 0x20);
    uVar11 = *(undefined4 *)((long)&CTX->h + 0x24);
    uVar12 = *(undefined4 *)((long)&CTX->h + 0x28);
    uVar13 = *(undefined4 *)((long)&CTX->h + 0x2c);
    uVar14 = *(undefined4 *)((long)&CTX->h + 0x30);
    uVar15 = *(undefined4 *)((long)&CTX->h + 0x34);
    uVar16 = *(undefined4 *)((long)&CTX->h + 0x38);
    uVar17 = *(undefined4 *)((long)&CTX->h + 0x3c);
  }
  else {
    uVar10 = *(undefined4 *)h;
    uVar11 = *(undefined4 *)((long)&CTX->h + 4);
    uVar12 = *(undefined4 *)((long)&CTX->h + 8);
    uVar13 = *(undefined4 *)((long)&CTX->h + 0xc);
    uVar14 = *(undefined4 *)((long)&CTX->h + 0x10);
    uVar15 = *(undefined4 *)((long)&CTX->h + 0x14);
    uVar16 = *(undefined4 *)((long)&CTX->h + 0x18);
    uVar17 = *(undefined4 *)((long)&CTX->h + 0x1c);
    uVar5 = (CTX->h).QWORD[4];
    uVar6 = (CTX->h).QWORD[5];
    uVar7 = (CTX->h).QWORD[7];
    *(unsigned_long_long *)(digest + 0x30) = (CTX->h).QWORD[6];
    *(unsigned_long_long *)(digest + 0x38) = uVar7;
    *(unsigned_long_long *)(digest + 0x20) = uVar5;
    *(unsigned_long_long *)(digest + 0x28) = uVar6;
  }
  *(undefined4 *)(digest + 0x10) = uVar14;
  *(undefined4 *)(digest + 0x14) = uVar15;
  *(undefined4 *)(digest + 0x18) = uVar16;
  *(undefined4 *)(digest + 0x1c) = uVar17;
  *(undefined4 *)digest = uVar10;
  *(undefined4 *)(digest + 4) = uVar11;
  *(undefined4 *)(digest + 8) = uVar12;
  *(undefined4 *)(digest + 0xc) = uVar13;
  return;
}

Assistant:

void gost2012_finish_hash(gost2012_hash_ctx * CTX, unsigned char *digest)
{
    stage3(CTX);

    CTX->bufsize = 0;

    if (CTX->digest_size == 256)
        memcpy(digest, &(CTX->h.QWORD[4]), 32);
    else
        memcpy(digest, &(CTX->h.QWORD[0]), 64);
}